

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,int newln_p)

{
  byte bVar1;
  void *pvVar2;
  mem_attr_t *pmVar3;
  VARR_uint8_t *pVVar4;
  uint uVar5;
  char *pcVar6;
  mem_attr_t *extraout_RDX;
  VARR_mem_attr_t *pVVar7;
  MIR_context_t ctx;
  uint32_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  
  ctx = gen_ctx->ctx;
  MIR_output_insn(ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
  uVar9 = *(ulong *)&insn->field_0x18;
  if (uVar9 >> 0x20 != 0) {
    puVar8 = &insn->ops[0].u.mem.nloc;
    uVar10 = 0;
    do {
      if (*puVar8 != 0 && (char)puVar8[-5] == '\v') {
        pVVar7 = gen_ctx->mem_attrs;
        if (((pVVar7 == (VARR_mem_attr_t *)0x0) || (pVVar7->varr == (mem_attr_t *)0x0)) ||
           (uVar9 = (ulong)*puVar8, pVVar7->els_num <= uVar9)) {
          print_insn_cold_1();
          if ((pVVar7 == (VARR_mem_attr_t *)0x0) ||
             (pvVar2 = ctx->setjmp_addr, *(long *)((long)pvVar2 + 0x18) == 0)) {
            insert_new_bb_after_cold_3();
LAB_001601e0:
            insert_new_bb_after_cold_1();
          }
          else {
            pmVar3 = pVVar7[1].varr;
            if (pmVar3 != (mem_attr_t *)0x0) {
              if (*(VARR_mem_attr_t **)((long)pvVar2 + 0x20) != (VARR_mem_attr_t *)0x0) {
                *(mem_attr_t **)(pmVar3 + 1) = extraout_RDX;
                *(mem_attr_t **)&extraout_RDX[1].alias = pmVar3;
                pVVar7[1].varr = extraout_RDX;
                *(VARR_mem_attr_t **)(extraout_RDX + 1) = pVVar7;
LAB_001601c7:
                uVar9 = (ulong)*(uint *)&ctx->wrapper_end_addr;
                *(uint *)&ctx->wrapper_end_addr = *(uint *)&ctx->wrapper_end_addr + 1;
                extraout_RDX->alloca_flag = (char)uVar9;
                extraout_RDX->disp_def_p = (char)(uVar9 >> 8);
                *(short *)&extraout_RDX->field_0x2 = (short)(uVar9 >> 0x10);
                extraout_RDX->type = (int)(uVar9 >> 0x20);
                return;
              }
              goto LAB_001601e0;
            }
            if (*(VARR_mem_attr_t **)((long)pvVar2 + 0x20) == pVVar7) {
              pVVar7[1].varr = extraout_RDX;
              *(VARR_mem_attr_t **)(extraout_RDX + 1) = pVVar7;
              extraout_RDX[1].alias = 0;
              extraout_RDX[1].nonalias = 0;
              *(mem_attr_t **)((long)pvVar2 + 0x20) = extraout_RDX;
              goto LAB_001601c7;
            }
          }
          insert_new_bb_after_cold_2();
          if (ctx->unspec_protos == (VARR_MIR_proto_t *)0x0) goto LAB_00160253;
          if (ctx->temp_string != (VARR_char *)0x0) {
            uVar5 = *(uint *)&ctx->c2mir_ctx;
            if (uVar5 != 0) {
              uVar9 = 0;
              pcVar6 = ctx->temp_string->varr + 8;
              do {
                if (*(int *)(pcVar6 + -8) != 0) {
                  (*(code *)ctx->unspec_protos)();
                  uVar5 = *(uint *)&ctx->c2mir_ctx;
                }
                uVar9 = uVar9 + 1;
                pcVar6 = pcVar6 + 0x20;
              } while (uVar9 < uVar5);
            }
LAB_00160253:
            *(undefined4 *)&ctx->c2mir_ctx = 0;
            ctx->gen_ctx = (gen_ctx *)0x0;
            pVVar4 = ctx->temp_data;
            if (pVVar4 != (VARR_uint8_t *)0x0) {
              if ((int)pVVar4->els_num != 0) {
                memset(pVVar4->varr,0xff,(pVVar4->els_num & 0xffffffff) << 2);
                return;
              }
              return;
            }
            HTAB_def_tab_el_t_clear_cold_2();
          }
          HTAB_def_tab_el_t_clear_cold_1();
          return;
        }
        bVar1 = pVVar7->varr[uVar9].alloca_flag;
        pcVar6 = "u";
        if ((bVar1 & 3) != 0) {
          pcVar6 = "au";
        }
        ctx = (MIR_context_t)gen_ctx->debug_file;
        if (bVar1 == 0) {
          pcVar6 = "";
        }
        fprintf((FILE *)ctx," # m%lu%s",uVar9,pcVar6);
        uVar9 = *(ulong *)&insn->field_0x18;
      }
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 0xc;
    } while (uVar10 < uVar9 >> 0x20);
  }
  if (newln_p != 0) {
    fputc(10,(FILE *)gen_ctx->debug_file);
    return;
  }
  return;
}

Assistant:

static void print_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, int newln_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  int flag;
  MIR_op_t op;

  MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
  for (size_t i = 0; i < insn->nops; i++) {
    op = insn->ops[i];
    if (op.mode == MIR_OP_VAR_MEM && op.u.var_mem.nloc != 0) {
      flag = VARR_GET (mem_attr_t, mem_attrs, op.u.var_mem.nloc).alloca_flag;
      fprintf (debug_file, " # m%lu%s", (unsigned long) op.u.var_mem.nloc,
               !flag                               ? ""
               : flag & (MAY_ALLOCA | MUST_ALLOCA) ? "au"
               : flag & MAY_ALLOCA                 ? "a"
                                                   : "u");
    }
  }
  if (newln_p) fprintf (debug_file, "\n");
}